

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O3

void __thiscall getarg_tests::doubledash::test_method(doubledash *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long *plVar7;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  lazy_ostream local_3c8;
  undefined1 *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  string *local_380;
  char **local_378;
  char *local_370;
  assertion_result local_368;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_350;
  char ***local_338;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  uint local_2b0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"-foo",(allocator<char> *)&local_3c8);
  local_2b0 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-bar",(allocator<char> *)&local_3c8)
  ;
  local_288 = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_350,__l,(allocator_type *)&local_3c8);
  SetupArgs(&local_args,&local_350);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_350);
  lVar4 = -0x50;
  plVar7 = local_298;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"--foo","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x188;
  file.m_begin = (iterator)&local_398;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a8,msg);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2f0,false);
  local_368._0_8_ = &local_380;
  local_380 = (string *)CONCAT71(local_380._1_7_,bVar2);
  local_378 = &local_388;
  local_388 = (char *)CONCAT71(local_388._1_7_,1);
  local_310._M_dataplus._M_p._0_1_ = bVar2;
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  local_330._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_330._M_string_length = 0xe7414d;
  local_2c0._8_8_ = &local_368;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01389268;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_338 = &local_378;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389268;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,&local_3c8,1,2,REQUIRE,0xe74349,(size_t)&local_330,0x188
             ,(string *)local_2d0,"true",&local_350);
  this_00 = &local_310.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&this_00->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  local_2d0._0_8_ = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"--foo=verbose --bar=1","");
  ResetArgs(&local_args,(string *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._0_8_ != &local_2c0) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2c0._M_allocated_capacity + 1));
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x18b;
  file_00.m_begin = (iterator)&local_3d8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3e8,
             msg_00);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_310._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-foo","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_2f0,"verbose");
  local_368.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_368.m_message.px = (element_type *)0x0;
  local_368.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_378 = (char **)0xe740e8;
  local_370 = "";
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2c0._8_8_ = &local_380;
  local_388 = "verbose";
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389798;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_338 = (char ***)&local_388;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_380 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,&local_3c8,1,2,REQUIRE,0xe743db,(size_t)&local_378,0x18b,local_2d0,
             "\"verbose\"",&local_350);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != this_00) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x18c;
  file_01.m_begin = (iterator)&local_3f8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_408,
             msg_01);
  local_3c8.m_empty = false;
  local_3c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_3b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"-bar","");
  local_380 = (string *)ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_310._M_dataplus._M_p._0_1_ = local_380 == (string *)0x1;
  local_388 = (char *)CONCAT44(local_388._4_4_,1);
  local_310._M_string_length = 0;
  local_310.field_2._M_allocated_capacity = 0;
  local_330._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_330._M_string_length = 0xe7414d;
  local_368._0_8_ = &local_380;
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_013892a8;
  local_2c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_378 = &local_388;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013890c8;
  local_350.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_338 = &local_378;
  local_2c0._8_8_ = &local_368;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_310,&local_3c8,1,2,REQUIRE,0xe744eb,(size_t)&local_330,0x18c
             ,local_2d0,"1",&local_350);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_310.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(doubledash)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "--foo");
    BOOST_CHECK_EQUAL(local_args.GetBoolArg("-foo", false), true);

    ResetArgs(local_args, "--foo=verbose --bar=1");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "verbose");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 0), 1);
}